

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool anon_unknown.dwarf_ca316::getStreamContents
               (InputStream *stream,vector<char,_std::allocator<char>_> *buffer)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  reference pvVar2;
  value_type local_31;
  long local_30;
  Int64 read;
  Int64 size;
  vector<char,_std::allocator<char>_> *pvStack_18;
  bool success;
  vector<char,_std::allocator<char>_> *buffer_local;
  InputStream *stream_local;
  
  size._7_1_ = 1;
  pvStack_18 = buffer;
  buffer_local = (vector<char,_std::allocator<char>_> *)stream;
  read = (**(code **)(*(long *)stream + 0x28))();
  if (0 < read) {
    std::vector<char,_std::allocator<char>_>::resize(pvStack_18,read);
    (**(code **)(*(long *)&(buffer_local->super__Vector_base<char,_std::allocator<char>_>)._M_impl +
                0x18))(buffer_local,0);
    pvVar1 = buffer_local;
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](pvStack_18,0);
    local_30 = (**(code **)(*(long *)&(pvVar1->super__Vector_base<char,_std::allocator<char>_>).
                                      _M_impl + 0x10))(pvVar1,pvVar2,read);
    size._7_1_ = local_30 == read;
  }
  local_31 = '\0';
  std::vector<char,_std::allocator<char>_>::push_back(pvStack_18,&local_31);
  return (bool)(size._7_1_ & 1);
}

Assistant:

bool getStreamContents(sf::InputStream& stream, std::vector<char>& buffer)
    {
        bool success = true;
        sf::Int64 size = stream.getSize();
        if (size > 0)
        {
            buffer.resize(static_cast<std::size_t>(size));
            stream.seek(0);
            sf::Int64 read = stream.read(&buffer[0], size);
            success = (read == size);
        }
        buffer.push_back('\0');
        return success;
    }